

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O2

void __thiscall ScriptOperator_ToCodeString_Test::TestBody(ScriptOperator_ToCodeString_Test *this)

{
  char *pcVar1;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28 [4];
  
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"ScriptOperator::OP_MIN.ToCodeString().c_str()","\"OP_MIN\"",
             (char *)local_28[0].ptr_,"OP_MIN");
  std::__cxx11::string::~string((string *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x67,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"ScriptOperator::OP_3.ToCodeString().c_str()","\"OP_3\"",
             (char *)local_28[0].ptr_,"OP_3");
  std::__cxx11::string::~string((string *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x68,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"ScriptOperator::OP_0.ToCodeString().c_str()","\"OP_0\"",
             (char *)local_28[0].ptr_,"OP_0");
  std::__cxx11::string::~string((string *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x69,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"ScriptOperator::OP_1.ToCodeString().c_str()","\"OP_1\"",
             (char *)local_28[0].ptr_,"OP_1");
  std::__cxx11::string::~string((string *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"ScriptOperator::OP_16.ToCodeString().c_str()","\"OP_16\"",
             (char *)local_28[0].ptr_,"OP_16");
  std::__cxx11::string::~string((string *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"ScriptOperator::OP_TRUE.ToCodeString().c_str()","\"OP_TRUE\"",
             (char *)local_28[0].ptr_,"OP_TRUE");
  std::__cxx11::string::~string((string *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"ScriptOperator::OP_FALSE.ToCodeString().c_str()","\"OP_FALSE\"",
             (char *)local_28[0].ptr_,"OP_FALSE");
  std::__cxx11::string::~string((string *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"ScriptOperator::OP_1NEGATE.ToCodeString().c_str()",
             "\"OP_1NEGATE\"",(char *)local_28[0].ptr_,"OP_1NEGATE");
  std::__cxx11::string::~string((string *)local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(ScriptOperator, ToCodeString) {
  EXPECT_STREQ(ScriptOperator::OP_MIN.ToCodeString().c_str(), "OP_MIN");
  EXPECT_STREQ(ScriptOperator::OP_3.ToCodeString().c_str(), "OP_3");
  EXPECT_STREQ(ScriptOperator::OP_0.ToCodeString().c_str(), "OP_0");
  EXPECT_STREQ(ScriptOperator::OP_1.ToCodeString().c_str(), "OP_1");
  EXPECT_STREQ(ScriptOperator::OP_16.ToCodeString().c_str(), "OP_16");
  EXPECT_STREQ(ScriptOperator::OP_TRUE.ToCodeString().c_str(), "OP_TRUE");
  EXPECT_STREQ(ScriptOperator::OP_FALSE.ToCodeString().c_str(), "OP_FALSE");
  EXPECT_STREQ(ScriptOperator::OP_1NEGATE.ToCodeString().c_str(), "OP_1NEGATE");
}